

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall QFSFileEnginePrivate::unmap(QFSFileEnginePrivate *this,uchar *ptr)

{
  byte bVar1;
  QFSFileEnginePrivate *this_00;
  Span *pSVar2;
  Entry *pEVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  const_iterator it;
  uchar *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEnginePrivate).q_ptr;
  local_30 = ptr;
  it = QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength>::constFindImpl<unsigned_char*>
                 ((QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength> *)&this->maps,
                  &local_30);
  if (it.i.d == (Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *)
                0x0 && it.i.bucket == 0) {
    unmap(this_00);
  }
  else {
    pSVar2 = (it.i.d)->spans;
    uVar6 = it.i.bucket >> 7;
    pEVar3 = pSVar2[uVar6].entries;
    bVar1 = pSVar2[uVar6].offsets[(uint)it.i.bucket & 0x7f];
    iVar5 = munmap(local_30 + -(long)*(int *)(pEVar3[bVar1].storage.data + 8),
                   *(size_t *)(pEVar3[bVar1].storage.data + 0x10));
    if (iVar5 != -1) {
      QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::erase(&this->maps,it);
      bVar4 = true;
      goto LAB_0012c69e;
    }
    unmap(this_00);
  }
  bVar4 = false;
LAB_0012c69e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::unmap(uchar *ptr)
{
#if !defined(Q_OS_INTEGRITY)
    Q_Q(QFSFileEngine);
    const auto it = std::as_const(maps).find(ptr);
    if (it == maps.cend()) {
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        return false;
    }

    uchar *start = ptr - it->start;
    size_t len = it->length;
    if (-1 == munmap(start, len)) {
        q->setError(QFile::UnspecifiedError, qt_error_string(errno));
        return false;
    }
    maps.erase(it);
    return true;
#else
    return false;
#endif
}